

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O3

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::CopyBuffer::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  AccessMode AVar1;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  _func_int *p_Var2;
  void *__s;
  _func_int *__n;
  Operation *pOVar3;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *this_00;
  Buffer *this_01;
  ulong uVar4;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  local_78;
  VkBufferCreateInfo local_68;
  
  pOVar3 = (Operation *)operator_new(0x30);
  AVar1 = this->m_mode;
  pOVar3->_vptr_Operation = (_func_int **)&PTR__Implementation_00d01c80;
  pOVar3[1]._vptr_Operation = (_func_int **)context;
  pOVar3[2]._vptr_Operation = (_func_int **)resource;
  *(AccessMode *)&pOVar3[3]._vptr_Operation = AVar1;
  pOVar3[4]._vptr_Operation = (_func_int **)0x0;
  this_00 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             *)(pOVar3 + 4);
  vk = context->m_vk;
  device = context->m_device;
  allocator = context->m_allocator;
  this_01 = (Buffer *)operator_new(0x30);
  makeBufferCreateInfo(&local_68,(resource->m_bufferData).size,(AVar1 == ACCESS_MODE_READ) + 1);
  synchronization::Buffer::Buffer(this_01,vk,device,allocator,&local_68,(MemoryRequirement)0x1);
  local_78.m_data.ptr = (Buffer *)0x0;
  if ((this_00->m_data).ptr != this_01) {
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    reset(this_00);
    (this_00->m_data).ptr = this_01;
  }
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            (&local_78);
  p_Var2 = pOVar3[4]._vptr_Operation[4];
  __s = *(void **)(p_Var2 + 0x18);
  __n = pOVar3[2]._vptr_Operation[5];
  if (*(int *)&pOVar3[3]._vptr_Operation == 0) {
    memset(__s,0,(size_t)__n);
  }
  else if (__n != (_func_int *)0x0) {
    uVar4 = 0;
    do {
      *(undefined1 *)((long)__s + uVar4) =
           (&synchronization::(anonymous_namespace)::fillPattern(void*,unsigned_long)::pattern)
           [uVar4 % 0xb];
      uVar4 = uVar4 + 1;
    } while ((_func_int *)(uVar4 & 0xffffffff) < __n);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(p_Var2 + 8),*(VkDeviceSize *)(p_Var2 + 0x10),
             (VkDeviceSize)pOVar3[2]._vptr_Operation[5]);
  (__return_storage_ptr__->
  super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  ).m_data.ptr = pOVar3;
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		return de::MovePtr<Operation>(new Implementation(context, resource, m_mode));
	}